

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O3

const_iterator * __thiscall
cmsys::
_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::operator++(_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
             *this)

{
  _Node *p_Var1;
  _Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var2;
  pointer pp_Var3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  char cVar7;
  
  p_Var1 = this->_M_cur;
  p_Var2 = p_Var1->_M_next;
  this->_M_cur = p_Var2;
  if (p_Var2 == (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    pp_Var3 = (this->_M_ht->_M_buckets).
              super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar5 = (p_Var1->_M_val)._M_dataplus._M_p;
    cVar7 = *pcVar5;
    if (cVar7 == '\0') {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        pcVar5 = pcVar5 + 1;
        uVar4 = (long)cVar7 + uVar4 * 5;
        cVar7 = *pcVar5;
      } while (cVar7 != '\0');
    }
    uVar6 = (long)(this->_M_ht->_M_buckets).
                  super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var3 >> 3;
    uVar4 = uVar4 % uVar6;
    do {
      uVar4 = uVar4 + 1;
      if (uVar6 <= uVar4) {
        return this;
      }
      p_Var2 = pp_Var3[uVar4];
      this->_M_cur = p_Var2;
    } while (p_Var2 == (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x0);
  }
  return this;
}

Assistant:

_Hashtable_const_iterator<_Val,_Key,_HF,_ExK,_EqK,_All>&
_Hashtable_const_iterator<_Val,_Key,_HF,_ExK,_EqK,_All>::operator++()
{
  const _Node* __old = _M_cur;
  _M_cur = _M_cur->_M_next;
  if (!_M_cur) {
    size_type __bucket = _M_ht->_M_bkt_num(__old->_M_val);
    while (!_M_cur && ++__bucket < _M_ht->_M_buckets.size())
      _M_cur = _M_ht->_M_buckets[__bucket];
  }
  return *this;
}